

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O1

void __thiscall AdaptorTest_QueueTest_Test::TestBody(AdaptorTest_QueueTest_Test *this)

{
  int iVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  queue<int,_Deque<int,_std::allocator<int>_>_> q;
  AssertHelper local_110;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  int local_f4;
  AssertHelper local_f0;
  string local_e8;
  Deque<int,_std::allocator<int>_> local_c8;
  
  Deque<int,_std::allocator<int>_>::Deque(&local_c8,(allocator<int> *)&local_e8);
  local_e8._M_dataplus._M_p._0_4_ = 0;
  do {
    Deque<int,_std::allocator<int>_>::push_back(&local_c8,(value_type *)&local_e8);
    iVar1 = (int)local_e8._M_dataplus._M_p + 1;
    bVar2 = (int)local_e8._M_dataplus._M_p < 99;
    local_e8._M_dataplus._M_p._0_4_ = iVar1;
  } while (bVar2);
  local_f4 = 0;
  while( true ) {
    local_108.ptr_._0_1_ = local_c8.current_.size_ != 0;
    local_100.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8.current_.size_ == 0) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)&local_108,(AssertionResult *)"q.empty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x1e,(char *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,
                                        (int)local_e8._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p) !=
          &local_e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p));
      }
      if (local_110.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_110.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
        local_110.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      goto LAB_0012eb1b;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_e8,"q.front()","i",(*local_c8.current_.begin_)->begin,&local_f4);
    if ((char)local_e8._M_dataplus._M_p == '\0') break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    Deque<int,_std::allocator<int>_>::pop_front(&local_c8);
    iVar1 = local_f4 + 1;
    bVar2 = 0x62 < local_f4;
    local_f4 = iVar1;
    if (bVar2) {
LAB_0012eb1b:
      Deque<int,_std::allocator<int>_>::~Deque(&local_c8);
      return;
    }
  }
  testing::Message::Message((Message *)&local_108);
  if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = *(char **)local_e8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
             ,0x1f,message);
  testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if (local_108.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108.ptr_ + 8))();
    }
    local_108.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  goto LAB_0012eb1b;
}

Assistant:

TEST(AdaptorTest, QueueTest) {
    std::queue<int, Deque<int>> q;
    for (int i = 0; i < 100; ++i) {
        q.push(i);
    }

    for (int i = 0; i < 100; ++i) {
        ASSERT_FALSE(q.empty());
        ASSERT_EQ(q.front(), i);
        q.pop();
    }
}